

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O1

void __thiscall
TestSchema::readData<avro::Parser<avro::ReaderImpl<avro::Validator>>>
          (TestSchema *this,Parser<avro::ReaderImpl<avro::Validator>_> *p)

{
  ReaderImpl<avro::Validator> *pRVar1;
  Validator *this_00;
  int32_t iVar2;
  ostream *poVar3;
  int32_t intval;
  undefined4 uStack_104;
  int64_t longval;
  bool boolval;
  undefined4 *local_f0;
  bool *local_e8;
  assertion_result local_e0;
  _func_int **local_c8;
  undefined **local_c0;
  undefined1 local_b8;
  undefined8 *local_b0;
  undefined4 **local_a8;
  ReaderImpl<avro::Validator> *local_a0;
  undefined **local_98;
  undefined **local_90;
  const_string local_88;
  undefined4 local_74;
  bool val;
  undefined7 uStack_6f;
  undefined1 local_68;
  undefined8 *local_60;
  bool **local_58;
  lazy_ostream local_50;
  undefined8 *local_40;
  char *local_38;
  
  printNext(this,p);
  pRVar1 = &p->reader_;
  avro::ReaderImpl<avro::Validator>::readRecord(pRVar1);
  printNext(this,p);
  longval = avro::Parser<avro::ReaderImpl<avro::Validator>_>::readLong(p);
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  _val = (undefined **)CONCAT71(uStack_6f,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&val,1);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1dd9a0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b7ac5);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x162;
  local_50.m_empty = false;
  local_c8 = (_func_int **)&PTR__lazy_ostream_001d9388;
  local_50._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001d9388;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(longval == 1000);
  _intval = CONCAT44(uStack_104,1000);
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_88.m_end = "";
  local_58 = &local_e8;
  local_68 = 0;
  local_90 = &PTR__lazy_ostream_001d93c8;
  _val = &PTR__lazy_ostream_001d93c8;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_f0;
  local_b8 = 0;
  local_98 = &PTR__lazy_ostream_001d9348;
  local_c0 = &PTR__lazy_ostream_001d9348;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = &intval;
  local_e8 = (bool *)&longval;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_50,&local_88,0x162,CHECK,CHECK_EQUAL,2,"longval",&val,"1000",&local_c0
            );
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  readMap<avro::Parser<avro::ReaderImpl<avro::Validator>>>(this,p);
  readArray<avro::Parser<avro::ReaderImpl<avro::Validator>>>(this,p);
  printNext(this,p);
  this_00 = &(p->reader_).validator_;
  avro::Validator::checkTypeExpected(this_00,AVRO_ENUM);
  longval = avro::ReaderImpl<avro::Validator>::readCount(pRVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enum choice ",0xc);
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  val = true;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&val,1);
  printNext(this,p);
  avro::Validator::checkTypeExpected(this_00,AVRO_UNION);
  longval = avro::ReaderImpl<avro::Validator>::readCount(pRVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Union path ",0xb);
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  val = true;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&val,1);
  readMap<avro::Parser<avro::ReaderImpl<avro::Validator>>>(this,p);
  readNestedRecord<avro::Parser<avro::ReaderImpl<avro::Validator>>>(this,p);
  printNext(this,p);
  local_a0 = pRVar1;
  avro::ReaderImpl<avro::Validator>::readValue(pRVar1,&val);
  boolval = val;
  poVar3 = std::ostream::_M_insert<bool>(true);
  _val = (undefined **)CONCAT71(uStack_6f,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&val,1);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1dd9a0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b7ac5);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x175;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_c8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  _intval = CONCAT71(stack0xfffffffffffffef9,1);
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)boolval;
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_88.m_end = "";
  local_68 = 0;
  _val = &PTR__lazy_ostream_001d9a30;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = &local_e8;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_001d9a30;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_f0;
  local_f0 = &intval;
  local_e8 = &boolval;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_50,&local_88,0x175,CHECK,CHECK_EQUAL,2,"boolval",&val,"true",&local_c0
            );
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  printNext(this,p);
  readFixed<avro::Parser<avro::ReaderImpl<avro::Validator>>>(this,p);
  printNext(this,p);
  longval = avro::Parser<avro::ReaderImpl<avro::Validator>_>::readLong(p);
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  _val = (undefined **)CONCAT71(uStack_6f,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&val,1);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1dd9a0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b7ac5);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x17d;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_c8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  _intval = 0x614b1cb2bfaa4383;
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(longval == 0x614b1cb2bfaa4383);
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_88.m_end = "";
  local_e8 = (bool *)&longval;
  local_68 = 0;
  _val = local_90;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = &local_e8;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_001d9f78;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_f0;
  local_f0 = &intval;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_50,&local_88,0x17d,CHECK,CHECK_EQUAL,2,"longval",&val,
             "7010728798977672067LL",&local_c0);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  printNext(this,p);
  iVar2 = avro::Parser<avro::ReaderImpl<avro::Validator>_>::readInt(p);
  _intval = CONCAT44(uStack_104,iVar2);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
  _val = (undefined **)CONCAT71(uStack_6f,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&val,1);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1dd9a0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b7ac5);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x182;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_c8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(intval == -0xd80);
  local_38 = "";
  local_f0 = &local_74;
  local_74 = 0xfffff280;
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_88.m_end = "";
  local_68 = 0;
  _val = local_98;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = &local_e8;
  local_b8 = 0;
  local_c0 = local_98;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_f0;
  local_e8 = (bool *)&intval;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_50,&local_88,0x182,CHECK,CHECK_EQUAL,2,"intval",&val,"-3456",&local_c0
            );
  pRVar1 = local_a0;
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  avro::ReaderImpl<avro::Validator>::readRecordEnd(pRVar1);
  return;
}

Assistant:

void readData(Parser &p)
    {
        printNext(p);
        p.readRecord();

        printNext(p);
        int64_t longval = p.readLong();
        std::cout << longval << '\n';
        BOOST_CHECK_EQUAL(longval, 1000);

        readMap(p);
        readArray(p);

        printNext(p);
        longval = p.readEnum();
        std::cout << "Enum choice " << longval << '\n';

        printNext(p);
        longval = p.readUnion();
        std::cout << "Union path " << longval << '\n';
        readMap(p);

        readNestedRecord(p);

        printNext(p);
        bool boolval = p.readBool();
        std::cout << boolval << '\n';
        BOOST_CHECK_EQUAL(boolval, true);

        printNext(p);
        readFixed(p);

        printNext(p);
        longval = p.readLong();
        std::cout << longval << '\n';
        BOOST_CHECK_EQUAL(longval, 7010728798977672067LL);

        printNext(p);
        int32_t intval = p.readInt();
        std::cout << intval << '\n';
        BOOST_CHECK_EQUAL(intval, -3456);
        p.readRecordEnd();
    }